

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::End(void)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiWindow **ppIVar4;
  ImGuiWindow *local_28;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  if (((GImGui->CurrentWindowStack).Size < 2) &&
     ((GImGui->WithinFrameScopeWithImplicitWindow & 1U) != 0)) {
    if ((GImGui->CurrentWindowStack).Size < 2) {
      __assert_fail("(g.CurrentWindowStack.Size > 1) && \"Calling End() too many times!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O0/_deps/imgui-src/imgui.cpp"
                    ,0x182e,"void ImGui::End()");
    }
  }
  else {
    if ((GImGui->CurrentWindowStack).Size < 1) {
      __assert_fail("g.CurrentWindowStack.Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O0/_deps/imgui-src/imgui.cpp"
                    ,0x1831,"void ImGui::End()");
    }
    if (((pIVar1->Flags & 0x1000000U) != 0) && ((GImGui->WithinEndChild & 1U) == 0)) {
      __assert_fail("(g.WithinEndChild) && \"Must call EndChild() and not End()!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Bktero[P]HelloWorldWithDearImGui/build_O0/_deps/imgui-src/imgui.cpp"
                    ,0x1835,"void ImGui::End()");
    }
    if ((pIVar1->DC).CurrentColumns != (ImGuiOldColumns *)0x0) {
      EndColumns();
    }
    PopClipRect();
    if ((pIVar1->Flags & 0x1000000U) == 0) {
      LogFinish();
    }
    ImVector<ImGuiWindow_*>::pop_back(&pIVar2->CurrentWindowStack);
    if ((pIVar1->Flags & 0x4000000U) != 0) {
      ImVector<ImGuiPopupData>::pop_back(&pIVar2->BeginPopupStack);
    }
    ImGuiStackSizes::CompareWithCurrentState(&(pIVar1->DC).StackSizesOnBegin);
    bVar3 = ImVector<ImGuiWindow_*>::empty(&pIVar2->CurrentWindowStack);
    if (bVar3) {
      local_28 = (ImGuiWindow *)0x0;
    }
    else {
      ppIVar4 = ImVector<ImGuiWindow_*>::back(&pIVar2->CurrentWindowStack);
      local_28 = *ppIVar4;
    }
    SetCurrentWindow(local_28);
  }
  return;
}

Assistant:

void ImGui::End()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // Error checking: verify that user hasn't called End() too many times!
    if (g.CurrentWindowStack.Size <= 1 && g.WithinFrameScopeWithImplicitWindow)
    {
        IM_ASSERT_USER_ERROR(g.CurrentWindowStack.Size > 1, "Calling End() too many times!");
        return;
    }
    IM_ASSERT(g.CurrentWindowStack.Size > 0);

    // Error checking: verify that user doesn't directly call End() on a child window.
    if (window->Flags & ImGuiWindowFlags_ChildWindow)
        IM_ASSERT_USER_ERROR(g.WithinEndChild, "Must call EndChild() and not End()!");

    // Close anything that is open
    if (window->DC.CurrentColumns)
        EndColumns();
    PopClipRect();   // Inner window clip rectangle

    // Stop logging
    if (!(window->Flags & ImGuiWindowFlags_ChildWindow))    // FIXME: add more options for scope of logging
        LogFinish();

    // Pop from window stack
    g.CurrentWindowStack.pop_back();
    if (window->Flags & ImGuiWindowFlags_Popup)
        g.BeginPopupStack.pop_back();
    window->DC.StackSizesOnBegin.CompareWithCurrentState();
    SetCurrentWindow(g.CurrentWindowStack.empty() ? NULL : g.CurrentWindowStack.back());
}